

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_vsnprintf(char *buffer,size_t buffer_len,char *format,__va_list_tag *args)

{
  int iVar1;
  int count;
  __va_list_tag *args_local;
  char *format_local;
  size_t buffer_len_local;
  char *buffer_local;
  
  iVar1 = vsnprintf(buffer,buffer_len,format,args);
  return iVar1;
}

Assistant:

static int
fct_vsnprintf(char *buffer,
              size_t buffer_len,
              char const *format,
              va_list args)
{
    int count =0;
    /* Older Microsoft compilers where not ANSI compliant with this
    function and you had to use _vsnprintf. I will assume that newer
    Microsoft Compilers start implementing vsnprintf. */
#if defined(_MSC_VER) && (_MSC_VER < 1400)
    count = _vsnprintf(buffer, buffer_len, format, args);
#elif defined(_MSC_VER) && (_MSC_VER >= 1400)
    count = vsnprintf_s(buffer, buffer_len, _TRUNCATE, format, args);
#else
    count = vsnprintf(buffer, buffer_len, format, args);
#endif
    return count;
}